

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::String> * __thiscall
asl::Array<asl::String>::insert(Array<asl::String> *this,int k,String *x)

{
  String *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  int iVar6;
  String *pSVar7;
  anon_union_16_2_78e7fdac_for_String_2 *local_48;
  
  pSVar7 = this->_a;
  iVar1 = *(int *)&pSVar7[-1].field_2;
  iVar2 = *(int *)((long)&pSVar7[-1].field_2 + 4);
  iVar5 = k;
  if (k < 0) {
    iVar5 = iVar1;
  }
  if (iVar1 < iVar2) {
    local_48 = &pSVar7[-1].field_2;
LAB_0011c3da:
    if (iVar1 - iVar5 != 0 && iVar5 <= iVar1) {
      memmove(pSVar7 + (long)iVar5 + 1,pSVar7 + iVar5,(long)(iVar1 - iVar5) * 0x18);
      pSVar7 = this->_a;
    }
    this_00 = pSVar7 + iVar5;
    iVar2 = x->_len;
    String::alloc(this_00,iVar2);
    this_00->_len = iVar2;
    if (this_00->_size == 0) {
      __dest = &pSVar7[iVar5].field_2;
    }
    else {
      __dest = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar7[iVar5].field_2._str;
    }
    if (x->_size == 0) {
      __src = &x->field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(x->field_2)._str;
    }
    memcpy(__dest,__src,(long)iVar2 + 1);
    *(int *)local_48 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = *(int *)((long)&this->_a[-1].field_2 + 8);
    iVar6 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar6 = iVar2 * 2 + 2;
    }
    local_48 = (anon_union_16_2_78e7fdac_for_String_2 *)
               realloc(&this->_a[-1].field_2,(long)iVar6 * 0x18 + 0x10);
    if (local_48 != (anon_union_16_2_78e7fdac_for_String_2 *)0x0) {
      pSVar7 = (String *)(local_48 + 1);
      this->_a = pSVar7;
      *(int *)((long)local_48 + 4) = iVar6;
      *(int *)((long)local_48 + 8) = iVar3;
      goto LAB_0011c3da;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = dup2;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}